

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

string * __thiscall
QPDFArgParser::getHelp(string *__return_storage_ptr__,QPDFArgParser *this,string *arg)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  const_iterator cVar4;
  mapped_type *ht;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
  *this_00;
  ostringstream msg;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  if (arg->_M_string_length == 0) {
LAB_0016195e:
    getTopHelp(this,(ostringstream *)local_1a0);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)arg);
    if (iVar3 == 0) {
      getAllHelp(this,(ostringstream *)local_1a0);
      goto LAB_0016196b;
    }
    peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
            ::find(&(peVar1->option_help)._M_t,arg);
    peVar2 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (cVar4._M_node == &(peVar1->option_help)._M_t._M_impl.super__Rb_tree_header._M_header) {
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
              ::find(&(peVar2->help_topics)._M_t,arg);
      if (cVar4._M_node == &(peVar2->help_topics)._M_t._M_impl.super__Rb_tree_header._M_header)
      goto LAB_0016195e;
      this_00 = &((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->help_topics;
    }
    else {
      this_00 = &peVar2->option_help;
    }
    ht = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
         ::operator[](this_00,arg);
    getTopicHelp(this,arg,ht,(ostringstream *)local_1a0);
  }
LAB_0016196b:
  peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,(peVar1->help_footer)._M_dataplus._M_p,
             (peVar1->help_footer)._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFArgParser::getHelp(std::string const& arg)
{
    std::ostringstream msg;
    if (arg.empty()) {
        getTopHelp(msg);
    } else {
        if (arg == "all") {
            getAllHelp(msg);
        } else if (m->option_help.count(arg)) {
            getTopicHelp(arg, m->option_help[arg], msg);
        } else if (m->help_topics.count(arg)) {
            getTopicHelp(arg, m->help_topics[arg], msg);
        } else {
            // should not be possible
            getTopHelp(msg);
        }
    }
    msg << m->help_footer;
    return msg.str();
}